

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildProfiled2CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  OpLayoutDynamicProfile2<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_> *pOVar4;
  OpLayoutDynamicProfile2<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_> *layout;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar2 = OpCodeAttr::IsProfiledOp(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x19b2,"(OpCodeAttr::IsProfiledOp(newOpcode))",
                       "OpCodeAttr::IsProfiledOp(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x19b3,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = Js::ByteCodeReader::
           GetLayout<Js::OpLayoutDynamicProfile2<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>>
                     (&this->m_jnReader);
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ClosureRegCheckPhase,sourceContextId,functionId);
  if (!bVar2) {
    DoClosureRegCheck(this,(int)(pOVar4->
                                super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                                Return);
    DoClosureRegCheck(this,(uint)(pOVar4->
                                 super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                                 Function);
  }
  BuildProfiled2CallI(this,newOpcode,offset,
                      (int)(pOVar4->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>)
                           .Return,
                      (uint)(pOVar4->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                            ).Function,
                      (ushort)(pOVar4->
                              super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                              ArgCount,pOVar4->profileId,pOVar4->profileId2);
  return;
}

Assistant:

void
IRBuilder::BuildProfiled2CallI(Js::OpCode newOpcode, uint32 offset)
{
    Assert(OpCodeAttr::IsProfiledOp(newOpcode));
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutDynamicProfile2<Js::OpLayoutT_CallI<SizePolicy>>>();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(layout->Return);
        this->DoClosureRegCheck(layout->Function);
    }

    BuildProfiled2CallI(newOpcode, offset, layout->Return, layout->Function, layout->ArgCount, layout->profileId, layout->profileId2);
}